

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtCofactor0(word *pTruth,int nWords,int iVar)

{
  int iVar1;
  int local_2c;
  int iStep;
  int i;
  word *pLimit;
  int shift;
  int w;
  int iVar_local;
  int nWords_local;
  word *pTruth_local;
  
  if (nWords == 1) {
    *pTruth = (*pTruth & s_Truths6Neg[iVar]) << ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f) |
              *pTruth & s_Truths6Neg[iVar];
  }
  else if (iVar < 6) {
    for (pLimit._4_4_ = 0; pLimit._4_4_ < nWords; pLimit._4_4_ = pLimit._4_4_ + 1) {
      pTruth[pLimit._4_4_] =
           (pTruth[pLimit._4_4_] & s_Truths6Neg[iVar]) << ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f)
           | pTruth[pLimit._4_4_] & s_Truths6Neg[iVar];
    }
  }
  else {
    iVar1 = Abc_TtWordNum(iVar);
    for (_iVar_local = pTruth; _iVar_local < pTruth + nWords;
        _iVar_local = _iVar_local + (iVar1 << 1)) {
      for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
        _iVar_local[local_2c + iVar1] = _iVar_local[local_2c];
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCofactor0( word * pTruth, int nWords, int iVar )
{
    if ( nWords == 1 )
        pTruth[0] = ((pTruth[0] & s_Truths6Neg[iVar]) << (1 << iVar)) | (pTruth[0] & s_Truths6Neg[iVar]);
    else if ( iVar <= 5 )
    {
        int w, shift = (1 << iVar);
        for ( w = 0; w < nWords; w++ )
            pTruth[w] = ((pTruth[w] & s_Truths6Neg[iVar]) << shift) | (pTruth[w] & s_Truths6Neg[iVar]);
    }
    else // if ( iVar > 5 )
    {
        word * pLimit = pTruth + nWords;
        int i, iStep = Abc_TtWordNum(iVar);
        for ( ; pTruth < pLimit; pTruth += 2*iStep )
            for ( i = 0; i < iStep; i++ )
                pTruth[i + iStep] = pTruth[i];
    }
}